

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolver.h
# Opt level: O1

void __thiscall chrono::ChSolver::~ChSolver(ChSolver *this)

{
  *(code **)this = chrono::ChVariablesGeneric::ChVariablesGeneric;
  if (*(ChSolver **)(this + 0x30) != this + 0x40) {
    operator_delete(*(ChSolver **)(this + 0x30),*(long *)(this + 0x40) + 1);
  }
  if (*(ChSolver **)(this + 0x10) != this + 0x20) {
    operator_delete(*(ChSolver **)(this + 0x10),*(long *)(this + 0x20) + 1);
    return;
  }
  return;
}

Assistant:

virtual ~ChSolver() {}